

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O2

size_t __thiscall
Memory::HeapBucketGroup<SmallAllocationBlockAttributes>::Check
          (HeapBucketGroup<SmallAllocationBlockAttributes> *this)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  
  sVar1 = SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>
          ::Check((SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>
                   *)this,true);
  sVar2 = SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
          ::Check(&(this->finalizableHeapBucket).
                   super_SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
                 );
  sVar3 = SmallLeafHeapBucketT<SmallAllocationBlockAttributes>::Check(&this->leafHeapBucket);
  sVar4 = SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
          ::Check(&(this->smallNormalWithBarrierHeapBucket).
                   super_SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                  ,true);
  sVar5 = SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
          ::Check(&(this->smallFinalizableWithBarrierHeapBucket).
                   super_SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                 );
  return sVar5 + sVar4 + sVar3 + sVar2 + sVar1;
}

Assistant:

size_t
HeapBucketGroup<TBlockAttributes>::Check()
{
    return heapBucket.Check() + finalizableHeapBucket.Check() + leafHeapBucket.Check()
#ifdef RECYCLER_VISITED_HOST
        + recyclerVisitedHostHeapBucket.Check()
#endif
#ifdef RECYCLER_WRITE_BARRIER
        + smallNormalWithBarrierHeapBucket.Check() + smallFinalizableWithBarrierHeapBucket.Check()
#endif
        ;
}